

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

LRUHandle * __thiscall
leveldb::anon_unknown_0::HandleTable::Remove(HandleTable *this,Slice *key,uint32_t hash)

{
  long lVar1;
  LRUHandle *pLVar2;
  LRUHandle **ppLVar3;
  undefined4 in_EDX;
  HandleTable *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  LRUHandle *result;
  LRUHandle **ptr;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppLVar3 = FindPointer(in_RSI,(Slice *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  pLVar2 = *ppLVar3;
  if (pLVar2 != (LRUHandle *)0x0) {
    *ppLVar3 = pLVar2->next_hash;
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pLVar2;
  }
  __stack_chk_fail();
}

Assistant:

LRUHandle* Remove(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = FindPointer(key, hash);
    LRUHandle* result = *ptr;
    if (result != nullptr) {
      *ptr = result->next_hash;
      --elems_;
    }
    return result;
  }